

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::GetTypeGet_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,Type *type)

{
  FullType FVar1;
  string local_110;
  string local_f0;
  Type local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Type *local_20;
  Type *type_local;
  RustGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (RustGenerator *)__return_storage_ptr__;
  FVar1 = anon_unknown_26::GetFullType(type);
  if (ftBool < FVar1) {
    if (FVar1 == ftTable) {
      WrapInNameSpace(&local_110,this,(local_20->struct_def->super_Definition).defined_namespace,
                      (string *)local_20->struct_def);
      std::operator+(__return_storage_ptr__,&local_110,"<\'a>");
      std::__cxx11::string::~string((string *)&local_110);
      return __return_storage_ptr__;
    }
    if (1 < FVar1 - ftEnumKey) {
      if (2 < FVar1 - ftArrayOfBuiltin) {
        WrapInNameSpace(__return_storage_ptr__,this,
                        (local_20->struct_def->super_Definition).defined_namespace,
                        (string *)local_20->struct_def);
        return __return_storage_ptr__;
      }
      Type::VectorType(&local_c0,local_20);
      GetTypeGet_abi_cxx11_(&local_a0,this,&local_c0);
      std::operator+(&local_80,"[",&local_a0);
      std::operator+(&local_60,&local_80,"; ");
      NumToString<unsigned_short>(&local_f0,local_20->fixed_length);
      std::operator+(&local_40,&local_60,&local_f0);
      std::operator+(__return_storage_ptr__,&local_40,"]");
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      return __return_storage_ptr__;
    }
  }
  GetTypeBasic_abi_cxx11_(__return_storage_ptr__,this,local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeGet(const Type &type) const {
    switch (GetFullType(type)) {
      case ftInteger:
      case ftFloat:
      case ftBool:
      case ftEnumKey:
      case ftUnionKey: {
        return GetTypeBasic(type);
      }
      case ftArrayOfBuiltin:
      case ftArrayOfEnum:
      case ftArrayOfStruct: {
        return "[" + GetTypeGet(type.VectorType()) + "; " +
               NumToString(type.fixed_length) + "]";
      }
      case ftTable: {
        return WrapInNameSpace(type.struct_def->defined_namespace,
                               type.struct_def->name) +
               "<'a>";
      }
      default: {
        return WrapInNameSpace(type.struct_def->defined_namespace,
                               type.struct_def->name);
      }
    }
  }